

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int64_t __thiscall
aeron::archive::AeronArchive::pollForResponse(AeronArchive *this,int64_t correlationId)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar1;
  uint16_t uVar2;
  pointer pCVar3;
  int64_t iVar4;
  ulong uVar5;
  element_type *this_00;
  AgentInvoker<aeron::ClientConductor> *this_01;
  ArchiveException *pAVar6;
  string *__rhs;
  char *pcVar7;
  duration dVar8;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_16a;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  string local_120;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Value local_2c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_28;
  Value code;
  TimePoint local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  int64_t correlationId_local;
  AeronArchive *this_local;
  
  deadline.__d.__r = (duration)(duration)correlationId;
  tStack_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20.__d.__r =
       (duration)std::chrono::operator+(&stack0xffffffffffffffd8,&this->messageTimeoutNs_);
  do {
    while( true ) {
      pollNextResponse(this,(int64_t)deadline.__d.__r,&local_20);
      pCVar3 = std::
               unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
               ::operator->(&this->controlResponsePoller_);
      iVar4 = ControlResponsePoller::controlSessionId(pCVar3);
      if (iVar4 == this->controlSessionId_) break;
LAB_001a2eca:
      this_00 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->aeron_);
      this_01 = Aeron::conductorAgentInvoker(this_00);
      concurrent::AgentInvoker<aeron::ClientConductor>::invoke(this_01);
    }
    pCVar3 = std::
             unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
             ::operator->(&this->controlResponsePoller_);
    uVar5 = ControlResponsePoller::templateId(pCVar3);
    uVar2 = io::aeron::archive::codecs::ControlResponse::sbeTemplateId();
    if (uVar5 != uVar2) goto LAB_001a2eca;
    pCVar3 = std::
             unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
             ::operator->(&this->controlResponsePoller_);
    local_2c = ControlResponsePoller::code(pCVar3);
    tVar1 = deadline;
    if (local_2c == ERROR) {
      local_16a = 1;
      pAVar6 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_f0,(long)deadline.__d.__r);
      std::operator+(&local_d0,"response for correlation id: ",&local_f0);
      std::operator+(&local_b0,&local_d0,", error: ");
      pCVar3 = std::
               unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
               ::operator->(&this->controlResponsePoller_);
      __rhs = ControlResponsePoller::errorMessage_abi_cxx11_(pCVar3);
      std::operator+(&local_90,&local_b0,__rhs);
      std::operator+(&local_70,&local_90,", relevant id: ");
      pCVar3 = std::
               unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
               ::operator->(&this->controlResponsePoller_);
      iVar4 = ControlResponsePoller::relevantId(pCVar3);
      std::__cxx11::to_string(&local_120,iVar4);
      std::operator+(&local_50,&local_70,&local_120);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_140,
                 "std::int64_t aeron::archive::AeronArchive::pollForResponse(std::int64_t)",
                 &local_141);
      pcVar7 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                         );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168,pcVar7,&local_169);
      ArchiveException::ArchiveException(pAVar6,&local_50,&local_140,&local_168,0x170);
      local_16a = 0;
      __cxa_throw(pAVar6,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
    }
    pCVar3 = std::
             unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
             ::operator->(&this->controlResponsePoller_);
    dVar8.__r = ControlResponsePoller::correlationId(pCVar3);
    if (tVar1.__d.__r == (duration)dVar8.__r) {
      if (local_2c == OK) {
        pCVar3 = std::
                 unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                 ::operator->(&this->controlResponsePoller_);
        iVar4 = ControlResponsePoller::relevantId(pCVar3);
        return iVar4;
      }
      pAVar6 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_1b0,local_2c);
      std::operator+(&local_190,"unexpected response: code=",&local_1b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1d0,
                 "std::int64_t aeron::archive::AeronArchive::pollForResponse(std::int64_t)",
                 &local_1d1);
      pcVar7 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                         );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f8,pcVar7,&local_1f9);
      ArchiveException::ArchiveException(pAVar6,&local_190,&local_1d0,&local_1f8,0x173);
      __cxa_throw(pAVar6,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
    }
  } while( true );
}

Assistant:

std::int64_t AeronArchive::pollForResponse(std::int64_t correlationId) {
    auto deadline = Clock::now() + messageTimeoutNs_;

    while (true) {
        pollNextResponse(correlationId, deadline);

        if (controlResponsePoller_->controlSessionId() != controlSessionId_ ||
            controlResponsePoller_->templateId() != codecs::ControlResponse::sbeTemplateId()) {
            aeron_->conductorAgentInvoker().invoke();
            continue;
        }

        auto code = controlResponsePoller_->code();
        if (code == codecs::ControlResponseCode::ERROR) {
            throw ArchiveException("response for correlation id: " + std::to_string(correlationId) +
                                       ", error: " + controlResponsePoller_->errorMessage() +
                                       ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                   SOURCEINFO);
        } else if (correlationId == controlResponsePoller_->correlationId()) {
            if (code != codecs::ControlResponseCode::OK) {
                throw ArchiveException("unexpected response: code=" + std::to_string(code), SOURCEINFO);
            }

            return controlResponsePoller_->relevantId();
        }
    }
}